

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

action Search::single_prediction_notLDF
                 (search_private *priv,example *ec,int policy,action *allowed_actions,
                 size_t allowed_actions_cnt,float *allowed_actions_cost,float *a_cost,
                 action override_action)

{
  string sVar1;
  v_array<char> vVar2;
  ulong uVar3;
  bool bVar4;
  uint32_t uVar5;
  polylabel *__src;
  size_t sVar6;
  undefined8 *__s;
  undefined8 uVar7;
  v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_> *this;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *pvVar8;
  stringstream *this_00;
  ostream *poVar9;
  long in_RCX;
  long in_RSI;
  search_private *in_RDI;
  ulong in_R8;
  float fVar10;
  pair<float,_unsigned_long> pVar11;
  float *in_stack_00000008;
  action in_stack_00000010;
  size_t k_4;
  pair<COST_SENSITIVE::wclass_&,_bool> p;
  bool query_needed;
  wclass *wc;
  size_t k_3;
  size_t cur_t;
  stringstream __msg;
  float cost_2;
  size_t k_2;
  float min_cost2;
  float min_cost_1;
  size_t K_1;
  float cost_1;
  action cl;
  size_t k_1;
  v_array<Search::action_cache> *this_cache;
  float cost;
  size_t k;
  float min_cost;
  size_t K;
  size_t ii;
  uint32_t act;
  size_t i;
  bool need_partial_predictions;
  polylabel old_label;
  vw *all;
  polylabel *in_stack_fffffffffffffb88;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  polylabel *in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  string *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  int iVar12;
  char *in_stack_fffffffffffffbb8;
  string *psVar13;
  vw_exception *in_stack_fffffffffffffbc0;
  _func_void_int_string_v_array<char> *p_Var14;
  size_t in_stack_fffffffffffffbc8;
  search_private *in_stack_fffffffffffffbd0;
  byte local_3c9;
  string local_3a8 [32];
  ulong local_388;
  allocator local_379;
  string local_378 [32];
  pair<COST_SENSITIVE::wclass_&,_bool> local_358;
  bool local_341;
  wclass *local_340;
  ulong local_338;
  pair<COST_SENSITIVE::wclass_&,_bool> *local_330;
  pair<COST_SENSITIVE::wclass_&,_bool> *local_328;
  pair<COST_SENSITIVE::wclass_&,_bool> *local_320;
  size_t local_318;
  undefined1 local_310 [32];
  ulong local_2f0;
  undefined1 local_2e1;
  learner<char,_char> *in_stack_fffffffffffffd50;
  ostream local_2a0;
  long local_128;
  float local_11c;
  float local_118;
  unsigned_long local_110;
  float local_104;
  ulong local_100;
  float local_f8;
  float local_f4;
  ulong local_f0;
  action_cache local_e8;
  float local_d8;
  action local_d4;
  ulong local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 *local_a8;
  float local_9c;
  ulong local_98;
  float local_8c;
  ulong local_88;
  ulong local_80;
  action local_74;
  ulong local_70;
  byte local_61;
  undefined1 local_60 [40];
  vw *local_38;
  ulong local_28;
  long local_20;
  long local_10;
  search_private *local_8;
  
  local_38 = in_RDI->all;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memcpy(local_60,(void *)(in_RSI + 0x6828),0x28);
  bVar4 = need_memo_foreach_action(local_8);
  local_3c9 = 1;
  if ((!bVar4) &&
     (((local_8->metaoverride == (BaseTask *)0x0 ||
       (local_3c9 = 1,
       local_8->metaoverride->_foreach_action ==
       (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)) &&
      (local_3c9 = 1, in_stack_00000010 == 0xffffffff)))) {
    local_3c9 = local_8->active_csoaa;
  }
  local_61 = local_3c9 & 1;
  if ((local_28 == 0) && (local_61 == 0)) {
    *(wclass **)(local_10 + 0x6828) = (local_8->empty_cs_label).costs._begin;
    *(wclass **)(local_10 + 0x6830) = (local_8->empty_cs_label).costs._end;
    *(wclass **)(local_10 + 0x6838) = (local_8->empty_cs_label).costs.end_array;
    *(size_t *)(local_10 + 0x6840) = (local_8->empty_cs_label).costs.erase_count;
  }
  else {
    __src = allowed_actions_to_ld
                      (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                       (action *)in_stack_fffffffffffffbc0,(size_t)in_stack_fffffffffffffbb8,
                       (float *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    memcpy((void *)(local_10 + 0x6828),__src,0x28);
  }
  for (local_70 = 0; uVar3 = local_70,
      sVar6 = v_array<COST_SENSITIVE::wclass>::size
                        ((v_array<COST_SENSITIVE::wclass> *)(local_10 + 0x6828)), uVar3 < sVar6;
      local_70 = local_70 + 1) {
  }
  LEARNER::as_singleline<char,char>(in_stack_fffffffffffffd50);
  LEARNER::learner<char,_example>::predict
            ((learner<char,_example> *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0)
             ,(example *)&in_stack_fffffffffffffb98->simple,
             CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  local_74 = *(action *)(local_10 + 0x6850);
  if (local_20 != 0) {
    for (local_80 = 0; local_80 < local_28; local_80 = local_80 + 1) {
    }
  }
  *in_stack_00000008 = *(float *)(local_10 + 0x68a8);
  if (in_stack_00000010 != 0xffffffff) {
    local_74 = in_stack_00000010;
  }
  if ((local_61 & 1) != 0) {
    local_88 = cs_get_costs_size((bool)in_stack_fffffffffffffb97,in_stack_fffffffffffffb88);
    local_8c = 3.4028235e+38;
    for (local_98 = 0; local_98 < local_88; local_98 = local_98 + 1) {
      local_9c = cs_get_cost_partial_prediction
                           ((bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffb98,
                            CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
      if (local_9c < local_8c) {
        local_8c = local_9c;
      }
    }
    local_a8 = (undefined8 *)0x0;
    bVar4 = need_memo_foreach_action(local_8);
    if ((bVar4) && (in_stack_00000010 == 0xffffffff)) {
      __s = (undefined8 *)operator_new(0x20);
      memset(__s,0,0x20);
      local_a8 = __s;
      v_init<Search::action_cache>();
      *local_a8 = local_c8;
      local_a8[1] = local_c0;
      local_a8[2] = local_b8;
      local_a8[3] = local_b0;
    }
    for (local_d0 = 0; local_d0 < local_88; local_d0 = local_d0 + 1) {
      local_d4 = cs_get_cost_index((bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffb98,
                                   CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
      local_d8 = cs_get_cost_partial_prediction
                           ((bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffb98,
                            CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
      if ((local_8->metaoverride != (BaseTask *)0x0) &&
         (local_8->metaoverride->_foreach_action !=
          (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)) {
        (*local_8->metaoverride->_foreach_action)
                  (local_8->metaoverride->sch,local_8->t - 1,local_8c,local_d4,local_d4 == local_74,
                   local_d8);
      }
      if (in_stack_00000010 == local_d4) {
        *in_stack_00000008 = local_d8;
      }
      if (local_a8 != (undefined8 *)0x0) {
        action_cache::action_cache(&local_e8,local_8c,local_d4,local_d4 == local_74,local_d8);
        v_array<Search::action_cache>::push_back
                  ((v_array<Search::action_cache> *)
                   CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                   (action_cache *)&in_stack_fffffffffffffb88->simple);
      }
    }
    if (local_a8 != (undefined8 *)0x0) {
      v_array<v_array<Search::action_cache>_*>::push_back
                ((v_array<v_array<Search::action_cache>_*> *)
                 CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                 (v_array<Search::action_cache> **)&in_stack_fffffffffffffb88->multi);
    }
  }
  if ((local_8->state == INIT_TRAIN) && (local_8->subsample_timesteps <= -1.0)) {
    local_f0 = cs_get_costs_size((bool)in_stack_fffffffffffffb97,in_stack_fffffffffffffb88);
    local_f4 = 3.4028235e+38;
    local_f8 = 3.4028235e+38;
    for (local_100 = 0; local_100 < local_f0; local_100 = local_100 + 1) {
      local_104 = cs_get_cost_partial_prediction
                            ((bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffb98,
                             CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
      if (local_f4 <= local_104) {
        if (local_104 < local_f8) {
          local_f8 = local_104;
        }
      }
      else {
        local_f8 = local_f4;
        local_f4 = local_104;
      }
    }
    if (local_f8 < 3.4028235e+38) {
      local_11c = local_f8 - local_f4;
      local_128 = local_8->t + local_8->meta_t;
      pVar11 = std::make_pair<float,unsigned_long>
                         ((float *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                          (unsigned_long *)&in_stack_fffffffffffffb88->empty);
      local_110 = pVar11.second;
      local_118 = pVar11.first;
      v_array<std::pair<float,_unsigned_long>_>::push_back
                ((v_array<std::pair<float,_unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                 (pair<float,_unsigned_long> *)&in_stack_fffffffffffffb88->simple);
    }
  }
  if ((local_8->state == INIT_TRAIN) && ((local_8->active_csoaa & 1U) != 0)) {
    if ((local_8->cb_learner & 1U) != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffd50);
      std::operator<<(&local_2a0,"cannot use active_csoaa with cb learning");
      local_2e1 = 1;
      uVar7 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                 in_stack_fffffffffffffba8);
      local_2e1 = 0;
      __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_2f0 = (local_8->t + local_8->meta_t) - 1;
    while (sVar6 = v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::size
                             (&local_8->active_known), sVar6 <= local_2f0) {
      memset(local_310,0,0x20);
      v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::push_back
                ((v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_> *)
                 CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                 (v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)
                 &in_stack_fffffffffffffb88->simple);
      v_init<std::pair<COST_SENSITIVE::wclass&,bool>>();
      this = &local_8->active_known;
      sVar6 = v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::size
                        (&local_8->active_known);
      pvVar8 = v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::operator[]
                         (this,sVar6 - 1);
      pvVar8->_begin = local_330;
      pvVar8->_end = local_328;
      pvVar8->end_array = local_320;
      pvVar8->erase_count = local_318;
    }
    v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::operator[]
              (&local_8->active_known,local_2f0);
    v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::clear
              ((v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)
               CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
    for (local_338 = 0; uVar3 = local_338,
        sVar6 = v_array<COST_SENSITIVE::wclass>::size
                          ((v_array<COST_SENSITIVE::wclass> *)(local_10 + 0x6828)), uVar3 < sVar6;
        local_338 = local_338 + 1) {
      local_340 = v_array<COST_SENSITIVE::wclass>::operator[]
                            ((v_array<COST_SENSITIVE::wclass> *)(local_10 + 0x6828),local_338);
      local_341 = v_array_contains<unsigned_int>
                            ((v_array<unsigned_int> *)(local_10 + 0x6850),local_340->class_index);
      std::pair<COST_SENSITIVE::wclass_&,_bool>::pair<bool_&,_true>(&local_358,local_340,&local_341)
      ;
      v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::operator[]
                (&local_8->active_known,local_2f0);
      v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::push_back
                ((v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)
                 CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                 (pair<COST_SENSITIVE::wclass_&,_bool> *)&in_stack_fffffffffffffb88->simple);
    }
  }
  if ((local_8->state == INIT_TEST) && (0 < local_38->raw_prediction)) {
    psVar13 = (string *)local_8->rawOutputStringStream;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_378,"",&local_379);
    std::__cxx11::stringstream::str(psVar13);
    std::__cxx11::string::~string(local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    for (local_388 = 0; uVar3 = local_388,
        sVar6 = cs_get_costs_size((bool)in_stack_fffffffffffffb97,in_stack_fffffffffffffb88),
        uVar3 < sVar6; local_388 = local_388 + 1) {
      if (local_388 != 0) {
        std::operator<<((ostream *)(local_8->rawOutputStringStream + 0x10),' ');
      }
      this_00 = local_8->rawOutputStringStream + 0x10;
      uVar5 = cs_get_cost_index((bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffb98,
                                CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
      poVar9 = (ostream *)std::ostream::operator<<(this_00,uVar5);
      poVar9 = std::operator<<(poVar9,':');
      fVar10 = cs_get_cost_partial_prediction
                         ((bool)in_stack_fffffffffffffba7,in_stack_fffffffffffffb98,
                          CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
      std::ostream::operator<<(poVar9,fVar10);
    }
    p_Var14 = local_38->print_text;
    iVar12 = local_38->raw_prediction;
    psVar13 = local_3a8;
    std::__cxx11::stringstream::str();
    sVar1._M_string_length._7_1_ = (char)((ulong)*(undefined8 *)(local_10 + 0x6880) >> 0x38);
    sVar1._0_15_ = *(undefined1 (*) [15])(local_10 + 0x6878);
    sVar1.field_2._M_allocated_capacity = *(undefined8 *)(local_10 + 0x6888);
    sVar1.field_2._8_7_ = (int7)*(undefined8 *)(local_10 + 0x6890);
    sVar1.field_2._M_local_buf[0xf] = (char)((ulong)*(undefined8 *)(local_10 + 0x6890) >> 0x38);
    vVar2._end._0_4_ = in_stack_fffffffffffffbb0;
    vVar2._begin = (char *)in_stack_fffffffffffffba8;
    vVar2._end._4_4_ = iVar12;
    vVar2.end_array = (char *)psVar13;
    vVar2.erase_count = (size_t)p_Var14;
    (*p_Var14)(iVar12,sVar1,vVar2);
    std::__cxx11::string::~string(local_3a8);
  }
  memcpy((void *)(local_10 + 0x6828),local_60,0x28);
  local_8->total_predictions_made = local_8->total_predictions_made + 1;
  local_8->num_features = *(long *)(local_10 + 0x68a0) + local_8->num_features;
  return local_74;
}

Assistant:

action single_prediction_notLDF(search_private& priv, example& ec, int policy, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost, float& a_cost,
    action override_action)  // if override_action != -1, then we return it as the action and a_cost is set to the
                             // appropriate cost for that action
{
  vw& all = *priv.all;
  polylabel old_label = ec.l;
  bool need_partial_predictions = need_memo_foreach_action(priv) ||
      (priv.metaoverride && priv.metaoverride->_foreach_action) || (override_action != (action)-1) || priv.active_csoaa;
  if ((allowed_actions_cnt > 0) || need_partial_predictions)
    ec.l = allowed_actions_to_ld(priv, 1, allowed_actions, allowed_actions_cnt, allowed_actions_cost);
  else
    ec.l.cs = priv.empty_cs_label;

  cdbg << "allowed_actions_cnt=" << allowed_actions_cnt << ", ec.l = [";
  for (size_t i = 0; i < ec.l.cs.costs.size(); i++)
    cdbg << ' ' << ec.l.cs.costs[i].class_index << ':' << ec.l.cs.costs[i].x;
  cdbg << " ]" << endl;

  as_singleline(priv.base_learner)->predict(ec, policy);

  uint32_t act = ec.pred.multiclass;
  cdbg << "a=" << act << " from";
  if (allowed_actions)
  {
    for (size_t ii = 0; ii < allowed_actions_cnt; ii++) cdbg << ' ' << allowed_actions[ii];
  }
  cdbg << endl;
  a_cost = ec.partial_prediction;
  cdbg << "a_cost = " << a_cost << endl;

  if (override_action != (action)-1)
    act = override_action;

  if (need_partial_predictions)
  {
    size_t K = cs_get_costs_size(priv.cb_learner, ec.l);
    float min_cost = FLT_MAX;
    for (size_t k = 0; k < K; k++)
    {
      float cost = cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
      if (cost < min_cost)
        min_cost = cost;
    }
    v_array<action_cache>* this_cache = nullptr;
    if (need_memo_foreach_action(priv) && (override_action == (action)-1))
    {
      this_cache = new v_array<action_cache>();
      *this_cache = v_init<action_cache>();
    }
    for (size_t k = 0; k < K; k++)
    {
      action cl = cs_get_cost_index(priv.cb_learner, ec.l, k);
      float cost = cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
      if (priv.metaoverride && priv.metaoverride->_foreach_action)
        priv.metaoverride->_foreach_action(*priv.metaoverride->sch, priv.t - 1, min_cost, cl, cl == act, cost);
      if (override_action == cl)
        a_cost = cost;
      if (this_cache)
        this_cache->push_back(action_cache(min_cost, cl, cl == act, cost));
    }
    if (this_cache)
    {
      assert(priv.memo_foreach_action.size() == priv.meta_t + priv.t - 1);
      priv.memo_foreach_action.push_back(this_cache);
      cdbg << "memo_foreach_action[" << priv.meta_t + priv.t - 1 << "] = " << this_cache << endl;
    }
  }

  if ((priv.state == INIT_TRAIN) && (priv.subsample_timesteps <= -1))  // active learning
  {
    size_t K = cs_get_costs_size(priv.cb_learner, ec.l);
    float min_cost = FLT_MAX, min_cost2 = FLT_MAX;
    for (size_t k = 0; k < K; k++)
    {
      float cost = cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
      if (cost < min_cost)
      {
        min_cost2 = min_cost;
        min_cost = cost;
      }
      else if (cost < min_cost2)
      {
        min_cost2 = cost;
      }
    }
    if (min_cost2 < FLT_MAX)
      priv.active_uncertainty.push_back(make_pair(min_cost2 - min_cost, priv.t + priv.meta_t));
  }
  if ((priv.state == INIT_TRAIN) && priv.active_csoaa)
  {
    if (priv.cb_learner)
      THROW("cannot use active_csoaa with cb learning");
    size_t cur_t = priv.t + priv.meta_t - 1;
    while (priv.active_known.size() <= cur_t)
    {
      priv.active_known.push_back(v_array<pair<CS::wclass&, bool>>());
      priv.active_known[priv.active_known.size() - 1] = v_init<pair<CS::wclass&, bool>>();
      cdbg << "active_known length now " << priv.active_known.size() << endl;
    }
    priv.active_known[cur_t].clear();
    assert(ec.l.cs.costs.size() > 0);
    for (size_t k = 0; k < ec.l.cs.costs.size(); k++)
    {
      /* priv.active_known[cur_t].push_back( ec.l.cs.costs[k].pred_is_certain
                                          ? ec.l.cs.costs[k].partial_prediction
                                          : FLT_MAX );
                                          cdbg << "active_known[" << cur_t << "][" << (priv.active_known[cur_t].size() -
         1) << "] = certain=" << ec.l.cs.costs[k].pred_is_certain << ", cost=" << ec.l.cs.costs[k].partial_prediction <<
         "}" << endl; */
      CS::wclass& wc = ec.l.cs.costs[k];
      // Get query_needed from pred
      bool query_needed = v_array_contains(ec.pred.multilabels.label_v, wc.class_index);
      pair<CS::wclass&, bool> p = {wc, query_needed};
      // Push into active_known[cur_t] with wc
      priv.active_known[cur_t].push_back(p);
      // cdbg << "active_known[" << cur_t << "][" << (priv.active_known[cur_t].size() - 1) << "] = " << wc.class_index
      // << ':' << wc.x << " pp=" << wc.partial_prediction << " query_needed=" << wc.query_needed << " max_pred=" <<
      // wc.max_pred << " min_pred=" << wc.min_pred << " is_range_overlapped=" << wc.is_range_overlapped << "
      // is_range_large=" << wc.is_range_large << endl;
      // query_needed=" << ec.l.cs.costs[k].query_needed << ", cost=" << ec.l.cs.costs[k].partial_prediction << "}" <<
      // endl;
    }
  }

  // generate raw predictions if necessary
  if ((priv.state == INIT_TEST) && (all.raw_prediction > 0))
  {
    priv.rawOutputStringStream->str("");
    for (size_t k = 0; k < cs_get_costs_size(priv.cb_learner, ec.l); k++)
    {
      if (k > 0)
        (*priv.rawOutputStringStream) << ' ';
      (*priv.rawOutputStringStream) << cs_get_cost_index(priv.cb_learner, ec.l, k) << ':'
                                    << cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
    }
    all.print_text(all.raw_prediction, priv.rawOutputStringStream->str(), ec.tag);
  }

  ec.l = old_label;

  priv.total_predictions_made++;
  priv.num_features += ec.num_features;

  return act;
}